

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

Aig_Man_t * Saig_ManRetimeMinAreaBackward(Aig_Man_t *pNew,int fVerbose)

{
  void *pvVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Man_t *p;
  Vec_Int_t *vInit;
  void **ppvVar4;
  Aig_Man_t *pAVar5;
  
  pVVar3 = Saig_ManGetRegistersToExclude(pNew);
  if ((fVerbose != 0) && (pVVar3->nSize != 0)) {
    printf("Excluding %d registers that cannot be backward retimed.\n");
  }
  while( true ) {
    Saig_ManHideBadRegs(pNew,pVVar3);
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
    pVVar3 = Nwk_ManDeriveRetimingCut(pNew,0,fVerbose);
    if (pNew->nRegs <= pVVar3->nSize) {
      if (pVVar3->pArray != (void **)0x0) {
        free(pVVar3->pArray);
      }
      free(pVVar3);
      return (Aig_Man_t *)0x0;
    }
    p = Saig_ManRetimeDupInitState(pNew,pVVar3);
    vInit = Saig_ManRetimeInitState(p);
    if (vInit != (Vec_Int_t *)0x0) {
      pAVar5 = Saig_ManRetimeDupBackward(pNew,pVVar3,vInit);
      if (vInit->pArray != (int *)0x0) {
        free(vInit->pArray);
      }
      free(vInit);
      if (pVVar3->pArray != (void **)0x0) {
        free(pVVar3->pArray);
      }
      free(pVVar3);
      Aig_ManStop(p);
      return pAVar5;
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
    uVar2 = Saig_ManRetimeUnsatCore(p,fVerbose);
    Aig_ManStop(p);
    if (fVerbose != 0) {
      printf("Excluding register %d.\n",(ulong)uVar2);
    }
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 8;
    ppvVar4 = (void **)malloc(0x40);
    pVVar3->pArray = ppvVar4;
    uVar2 = uVar2 + pNew->nTruePos;
    if (((int)uVar2 < 0) || (pNew->vCos->nSize <= (int)uVar2)) break;
    pvVar1 = pNew->vCos->pArray[uVar2];
    pVVar3->nSize = 1;
    *ppvVar4 = pvVar1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManRetimeMinAreaBackward( Aig_Man_t * pNew, int fVerbose )
{
    Aig_Man_t * pInit, * pFinal;
    Vec_Ptr_t * vBadRegs, * vCut;
    Vec_Int_t * vInit;
    int iBadReg;
    // transform the AIG to have no bad registers
    vBadRegs = Saig_ManGetRegistersToExclude( pNew );
    if ( fVerbose && Vec_PtrSize(vBadRegs) )
        printf( "Excluding %d registers that cannot be backward retimed.\n", Vec_PtrSize(vBadRegs) ); 
    while ( 1 )
    {
        Saig_ManHideBadRegs( pNew, vBadRegs );
        Vec_PtrFree( vBadRegs );
        // compute cut
        vCut = Nwk_ManDeriveRetimingCut( pNew, 0, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            Vec_PtrFree( vCut );
            return NULL;
        }
        // derive the initial state
        pInit = Saig_ManRetimeDupInitState( pNew, vCut );
        vInit = Saig_ManRetimeInitState( pInit );
        if ( vInit != NULL )
        {
            pFinal = Saig_ManRetimeDupBackward( pNew, vCut, vInit );
            Vec_IntFree( vInit );
            Vec_PtrFree( vCut );
            Aig_ManStop( pInit );
            return pFinal;
        }
        Vec_PtrFree( vCut );
        // there is no initial state - find the offending output
        iBadReg = Saig_ManRetimeUnsatCore( pInit, fVerbose );
        Aig_ManStop( pInit );
        if ( fVerbose )
            printf( "Excluding register %d.\n", iBadReg ); 
        // prepare to remove this output
        vBadRegs = Vec_PtrAlloc( 1 );
        Vec_PtrPush( vBadRegs, Aig_ManCo( pNew, Saig_ManPoNum(pNew) + iBadReg ) );
    }
    return NULL;
}